

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O1

void test_regular(rtr_socket *socket)

{
  int iVar1;
  uint32_t sn;
  uint32_t sn_00;
  uint32_t sn_01;
  uint32_t sn_02;
  uint16_t in_SI;
  uint16_t uVar2;
  aspa_record *paVar3;
  rtr_socket *prVar4;
  size_t in_R8;
  long in_FS_OFFSET;
  aspa_record _records571 [4];
  update_callback _callbacks561 [1];
  aspa_record _records553 [3];
  update_callback _callbacks544 [3];
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  aspa_record local_458;
  undefined4 local_440;
  undefined8 local_438;
  undefined8 *local_430;
  undefined4 local_428;
  undefined8 local_420;
  undefined8 *local_418;
  undefined4 local_410;
  undefined8 local_408;
  undefined1 *local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  aspa_record local_3b8;
  undefined4 local_3a0;
  undefined8 local_398;
  undefined8 *local_390;
  undefined4 local_388;
  undefined8 local_380;
  undefined8 *local_378;
  undefined4 local_370;
  undefined8 local_368;
  undefined8 *local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  update_callback local_328;
  undefined8 local_300;
  undefined4 local_2f8;
  undefined8 local_2f0;
  undefined8 *local_2e8;
  undefined1 local_2e0;
  undefined8 local_2d8;
  undefined4 local_2d0;
  undefined8 local_2c8;
  undefined8 *local_2c0;
  undefined1 local_2b8;
  undefined8 local_2b0;
  undefined4 local_2a8;
  undefined8 local_2a0;
  undefined8 *local_298;
  undefined1 local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  uint32_t local_248 [4];
  aspa_record local_238;
  undefined4 local_220;
  undefined8 local_218;
  undefined8 *local_210;
  undefined4 local_208;
  undefined8 local_200;
  undefined8 *local_1f8;
  undefined4 local_1f0;
  undefined8 local_1e8;
  undefined8 *local_1e0;
  uint32_t local_1d8 [4];
  update_callback local_1c8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  uint32_t local_168 [4];
  aspa_record local_158;
  undefined4 local_140;
  undefined8 local_138;
  undefined8 *local_130;
  undefined4 local_128;
  undefined8 local_120;
  undefined8 *local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  uint32_t local_e8 [4];
  update_callback local_d8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_a0;
  undefined8 *local_98;
  undefined1 local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined8 local_78;
  undefined8 *local_70;
  undefined1 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  begin_cache_response((uint8_t)socket,in_SI);
  local_40 = 0x44e0000044d;
  uStack_38 = 0x4500000044f;
  append_aspa('\x01','L',(uint32_t)&local_40,(uint32_t *)0x4,in_R8);
  local_50 = 0x44e0000044c;
  uStack_48 = 0x4500000044f;
  append_aspa('\x01','M',(uint32_t)&local_50,(uint32_t *)0x4,in_R8);
  local_60 = 0x89a00000899;
  uStack_58 = 0x89c0000089b;
  uVar2 = 0x898;
  append_aspa('\x01',0x98,(uint32_t)&local_60,(uint32_t *)0x4,in_R8);
  end_cache_response(0xb5,uVar2,sn);
  expected_callbacks = &local_d8;
  local_d8.source = (aspa_table *)0x0;
  local_d8.record.customer_asn = 0x44c;
  local_d8.record.provider_count = 4;
  local_d8.record.provider_asns = local_e8;
  local_e8[0] = 0x44d;
  local_e8[1] = 0x44e;
  local_e8[2] = 0x44f;
  local_e8[3] = 0x450;
  local_d8.type = ASPA_ADD;
  local_b0 = 0;
  local_a8 = 0x44d;
  local_a0 = 4;
  local_98 = &local_f8;
  local_f8 = 0x44e0000044c;
  uStack_f0 = 0x4500000044f;
  local_90 = 1;
  local_88 = 0;
  local_80 = 0x898;
  local_78 = 4;
  local_70 = &local_108;
  local_108 = 0x89a00000899;
  uStack_100 = 0x89c0000089b;
  local_68 = 1;
  callback_count = 3;
  callback_index = 0;
  iVar1 = rtr_sync(socket);
  if (iVar1 != 0) {
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x222,"void test_regular(struct rtr_socket *)");
  }
  if (callback_index != callback_count) {
    __assert_fail("callback_index == callback_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x223,"void test_regular(struct rtr_socket *)");
  }
  paVar3 = &local_158;
  local_158.customer_asn = 0x44c;
  local_158.provider_count = 4;
  local_158.provider_asns = local_168;
  local_168[0] = 0x44d;
  local_168[1] = 0x44e;
  local_168[2] = 0x44f;
  local_168[3] = 0x450;
  local_140 = 0x44d;
  local_138 = 4;
  local_130 = &local_178;
  local_178 = 0x44e0000044c;
  uStack_170 = 0x4500000044f;
  local_128 = 0x898;
  local_120 = 4;
  local_118 = &local_188;
  local_188 = 0x89a00000899;
  uStack_180 = 0x89c0000089b;
  prVar4 = socket;
  assert_table(socket,paVar3,3);
  begin_cache_response((uint8_t)prVar4,(uint16_t)paVar3);
  local_198 = 0xce600000ce5;
  uStack_190 = 0xce800000ce7;
  uVar2 = 0xce4;
  append_aspa('\x01',0xe4,(uint32_t)&local_198,(uint32_t *)0x4,in_R8);
  end_cache_response(0xbc,uVar2,sn_00);
  expected_callbacks = &local_1c8;
  local_1c8.source = (aspa_table *)0x0;
  local_1c8.record.customer_asn = 0xce4;
  local_1c8.record.provider_count = 4;
  local_1c8.record.provider_asns = local_1d8;
  local_1d8[0] = 0xce5;
  local_1d8[1] = 0xce6;
  local_1d8[2] = 0xce7;
  local_1d8[3] = 0xce8;
  local_1c8.type = ASPA_ADD;
  callback_count = 1;
  callback_index = 0;
  iVar1 = rtr_sync(socket);
  if (iVar1 != 0) {
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x233,"void test_regular(struct rtr_socket *)");
  }
  if (callback_index != callback_count) {
    __assert_fail("callback_index == callback_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x234,"void test_regular(struct rtr_socket *)");
  }
  paVar3 = &local_238;
  local_238.customer_asn = 0x44c;
  local_238.provider_count = 4;
  local_238.provider_asns = local_248;
  local_248[0] = 0x44d;
  local_248[1] = 0x44e;
  local_248[2] = 0x44f;
  local_248[3] = 0x450;
  local_220 = 0x44d;
  local_218 = 4;
  local_210 = &local_258;
  local_258 = 0x44e0000044c;
  uStack_250 = 0x4500000044f;
  local_208 = 0x898;
  local_200 = 4;
  local_1f8 = &local_268;
  local_268 = 0x89a00000899;
  uStack_260 = 0x89c0000089b;
  local_1f0 = 0xce4;
  local_1e8 = 4;
  local_1e0 = &local_278;
  local_278 = 0xce600000ce5;
  uStack_270 = 0xce800000ce7;
  prVar4 = socket;
  assert_table(socket,paVar3,4);
  begin_cache_response((uint8_t)prVar4,(uint16_t)paVar3);
  append_aspa('\0','L',0,(uint32_t *)0x0,in_R8);
  append_aspa('\0',0x98,0,(uint32_t *)0x0,in_R8);
  local_288 = 0x4b2000004b1;
  uStack_280 = 0x4b4000004b3;
  append_aspa('\x01','L',(uint32_t)&local_288,(uint32_t *)0x4,in_R8);
  uVar2 = 0;
  append_aspa('\x01','\0',0,(uint32_t *)0x0,in_R8);
  end_cache_response(0xbc,uVar2,sn_01);
  expected_callbacks = &local_328;
  local_328.source = (aspa_table *)0x0;
  local_328.record.customer_asn = 0;
  local_328.record.provider_count = 0;
  local_328.record.provider_asns = (uint32_t *)0x0;
  local_328.type = ASPA_ADD;
  local_300 = 0;
  local_2f8 = 0x44c;
  local_2f0 = 4;
  local_2e8 = &local_338;
  local_338 = 0x44e0000044d;
  uStack_330 = 0x4500000044f;
  local_2e0 = 0;
  local_2d8 = 0;
  local_2d0 = 0x44c;
  local_2c8 = 4;
  local_2c0 = &local_348;
  local_348 = 0x4b2000004b1;
  uStack_340 = 0x4b4000004b3;
  local_2b8 = 1;
  local_2b0 = 0;
  local_2a8 = 0x898;
  local_2a0 = 4;
  local_298 = &local_358;
  local_358 = 0x89a00000899;
  uStack_350 = 0x89c0000089b;
  local_290 = 0;
  callback_count = 4;
  callback_index = 0;
  iVar1 = rtr_sync(socket);
  if (iVar1 != 0) {
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x24b,"void test_regular(struct rtr_socket *)");
  }
  if (callback_index != callback_count) {
    __assert_fail("callback_index == callback_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x24c,"void test_regular(struct rtr_socket *)");
  }
  paVar3 = &local_3b8;
  local_3b8.customer_asn = 0;
  local_3b8.provider_count = 0;
  local_3b8.provider_asns = (uint32_t *)0x0;
  local_3a0 = 0x44c;
  local_398 = 4;
  local_390 = &local_3c8;
  local_3c8 = 0x4b2000004b1;
  uStack_3c0 = 0x4b4000004b3;
  local_388 = 0x44d;
  local_380 = 4;
  local_378 = &local_3d8;
  local_3d8 = 0x44e0000044c;
  uStack_3d0 = 0x4500000044f;
  local_370 = 0xce4;
  local_368 = 4;
  local_360 = &local_3e8;
  local_3e8 = 0xce600000ce5;
  uStack_3e0 = 0xce800000ce7;
  prVar4 = socket;
  assert_table(socket,paVar3,4);
  begin_cache_response((uint8_t)prVar4,(uint16_t)paVar3);
  local_3f8 = 0x4b2000004b1;
  uStack_3f0 = 0x4b4000004b3;
  append_aspa('\x01','m',(uint32_t)&local_3f8,(uint32_t *)0x4,in_R8);
  uVar2 = 0x76d;
  append_aspa('\0','m',0,(uint32_t *)0x0,in_R8);
  end_cache_response(0xbc,uVar2,sn_02);
  printf("Ignoring No-Ops!");
  expected_callbacks = (update_callback *)0x0;
  callback_index = 0;
  callback_count = 0;
  iVar1 = rtr_sync(socket);
  if (iVar1 != 0) {
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x266,"void test_regular(struct rtr_socket *)");
  }
  if (callback_index == callback_count) {
    local_458.customer_asn = 0;
    local_458.provider_count = 0;
    local_458.provider_asns = (uint32_t *)0x0;
    local_440 = 0x44c;
    local_438 = 4;
    local_430 = &local_468;
    local_468 = 0x4b2000004b1;
    uStack_460 = 0x4b4000004b3;
    local_428 = 0x44d;
    local_420 = 4;
    local_418 = &local_478;
    local_478 = 0x44e0000044c;
    uStack_470 = 0x4500000044f;
    local_410 = 0xce4;
    local_408 = 4;
    local_488 = 0xce600000ce5;
    uStack_480 = 0xce800000ce7;
    local_400 = (undefined1 *)&local_488;
    assert_table(socket,&local_458,4);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("callback_index == callback_count",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                ,0x267,"void test_regular(struct rtr_socket *)");
}

Assistant:

static void test_regular(struct rtr_socket *socket)
{
	// Test: regular announcements and withdrawals
	// Expect: OK
	// DB: withdrawn records get removed, newly announced are added

	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1100, ASNS(1101, 1102, 1103, 1104));
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1101, ASNS(1100, 1102, 1103, 1104));
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 2200, ASNS(2201, 2202, 2203, 2204));
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 437);

	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(1100, ASNS(1101, 1102, 1103, 1104))),
		ADDED(RECORD(1101, ASNS(1100, 1102, 1103, 1104))),
		ADDED(RECORD(2200, ASNS(2201, 2202, 2203, 2204))),
	);

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket,
		RECORD(1100, ASNS(1101, 1102, 1103, 1104)),
		RECORD(1101, ASNS(1100, 1102, 1103, 1104)),
		RECORD(2200, ASNS(2201, 2202, 2203, 2204)),
	);

	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 3300, ASNS(3301, 3302, 3303, 3304));
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 444);

	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(3300, ASNS(3301, 3302, 3303, 3304))),
	);

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket,
		RECORD(1100, ASNS(1101, 1102, 1103, 1104)),
		RECORD(1101, ASNS(1100, 1102, 1103, 1104)),
		RECORD(2200, ASNS(2201, 2202, 2203, 2204)),
		RECORD(3300, ASNS(3301, 3302, 3303, 3304))
	);

	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_WITHDRAW, 1100, ASNS());
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_WITHDRAW, 2200, ASNS());
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1100, ASNS(1201, 1202, 1203, 1204));
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 0, ASNS());
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 444);

	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(0, ASNS())),
		REMOVED(RECORD(1100, ASNS(1101, 1102, 1103, 1104))),
		ADDED(RECORD(1100, ASNS(1201, 1202, 1203, 1204))),
		REMOVED(RECORD(2200, ASNS(2201, 2202, 2203, 2204))),
	);

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket,
		RECORD(0, ASNS()),
		RECORD(1100, ASNS(1201, 1202, 1203, 1204)),
		RECORD(1101, ASNS(1100, 1102, 1103, 1104)),
		RECORD(3300, ASNS(3301, 3302, 3303, 3304)),
	);

	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	// The following two are complementary (no-op)
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1901, ASNS(1201, 1202, 1203, 1204));
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_WITHDRAW, 1901, ASNS());
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 444);

#if ASPA_NOTIFY_NO_OPS
	printf("Notifying No-Ops!");
	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(1901, ASNS(1201, 1202, 1203, 1204))),
		REMOVED(RECORD(1901, ASNS(1201, 1202, 1203, 1204))),
	);
#else
	printf("Ignoring No-Ops!");
	EXPECT_NO_UPDATE_CALLBACKS();
#endif

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket,
		RECORD(0, ASNS()),
		RECORD(1100, ASNS(1201, 1202, 1203, 1204)),
		RECORD(1101, ASNS(1100, 1102, 1103, 1104)),
		RECORD(3300, ASNS(3301, 3302, 3303, 3304)),
	);
}